

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

void duckdb::RegularLikeFunction<duckdb::LikeOperator,false>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  idx_t count;
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  BoundFunctionExpression *pBVar9;
  LikeMatcher *this_00;
  reference pvVar10;
  reference right;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  idx_t iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  idx_t idx_in_entry;
  ulong uVar17;
  ulong uVar18;
  data_ptr_t pdVar19;
  idx_t iVar20;
  data_ptr_t local_c8;
  anon_union_16_2_67f50693_for_value local_a8;
  ulong local_90;
  reference local_88;
  idx_t local_80;
  anon_union_16_2_67f50693_for_value local_78;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar9 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  if ((pBVar9->bind_info).
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl == (FunctionData *)0x0) {
    pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    right = vector<duckdb::Vector,_true>::operator[](&input->data,1);
    BinaryExecutor::
    ExecuteSwitch<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::LikeOperator,bool>
              (pvVar10,right,result,input->count,false);
    return;
  }
  this_00 = (LikeMatcher *)
            unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar9->bind_info);
  pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  count = input->count;
  if (pvVar10->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    local_c8 = pvVar10->data;
    FlatVector::VerifyFlatVector(pvVar10);
    FlatVector::VerifyFlatVector(result);
    puVar2 = (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 == (unsigned_long *)0x0) {
      if (count != 0) {
        local_c8 = local_c8 + 8;
        iVar20 = 0;
        do {
          local_78._0_8_ = *(undefined8 *)(local_c8 + -8);
          local_78.pointer.ptr = (char *)*(undefined8 *)local_c8;
          bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_78.pointer);
          pdVar1[iVar20] = bVar8;
          iVar20 = iVar20 + 1;
          local_c8 = local_c8 + 0x10;
        } while (count != iVar20);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        local_90 = count + 0x3f >> 6;
        uVar16 = 0;
        uVar18 = 0;
        local_88 = pvVar10;
        do {
          puVar2 = (local_88->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            uVar14 = uVar18 + 0x40;
            if (count <= uVar18 + 0x40) {
              uVar14 = count;
            }
LAB_014bbf0a:
            uVar15 = uVar18;
            if (uVar18 < uVar14) {
              pdVar19 = local_c8 + uVar18 * 0x10 + 8;
              do {
                local_78._0_8_ = *(undefined8 *)(pdVar19 + -8);
                local_78.pointer.ptr = (char *)*(undefined8 *)pdVar19;
                bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_78.pointer);
                pdVar1[uVar18] = bVar8;
                uVar18 = uVar18 + 1;
                pdVar19 = pdVar19 + 0x10;
                uVar15 = uVar14;
              } while (uVar14 != uVar18);
            }
          }
          else {
            uVar3 = puVar2[uVar16];
            uVar14 = uVar18 + 0x40;
            if (count <= uVar18 + 0x40) {
              uVar14 = count;
            }
            uVar15 = uVar14;
            if (uVar3 != 0) {
              if (uVar3 == 0xffffffffffffffff) goto LAB_014bbf0a;
              uVar15 = uVar18;
              if (uVar18 < uVar14) {
                pdVar19 = local_c8 + uVar18 * 0x10 + 8;
                uVar17 = 0;
                do {
                  if ((uVar3 >> (uVar17 & 0x3f) & 1) != 0) {
                    local_78._0_8_ = *(undefined8 *)(pdVar19 + -8);
                    local_78.pointer.ptr = (char *)*(undefined8 *)pdVar19;
                    bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_78.pointer);
                    pdVar1[uVar17 + uVar18] = bVar8;
                  }
                  uVar17 = uVar17 + 1;
                  pdVar19 = pdVar19 + 0x10;
                  uVar15 = uVar14;
                } while (uVar14 - uVar18 != uVar17);
              }
            }
          }
          uVar16 = uVar16 + 1;
          uVar18 = uVar15;
        } while (uVar16 != local_90);
      }
    }
  }
  else if (pvVar10->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar1 = result->data;
    pdVar19 = pvVar10->data;
    puVar2 = (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    local_78._0_8_ = *(undefined8 *)pdVar19;
    local_78.pointer.ptr = (char *)*(undefined8 *)(pdVar19 + 8);
    bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_78.pointer);
    *pdVar1 = bVar8;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78.pointer);
    Vector::ToUnifiedFormat(pvVar10,count,(UnifiedVectorFormat *)&local_78.pointer);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      if (count != 0) {
        lVar4 = *(long *)local_78._0_8_;
        iVar20 = 0;
        do {
          iVar13 = iVar20;
          if (lVar4 != 0) {
            iVar13 = (idx_t)*(uint *)(lVar4 + iVar20 * 4);
          }
          local_a8._0_8_ = *(undefined8 *)(local_78.pointer.ptr + iVar13 * 0x10);
          local_a8.pointer.ptr = (char *)*(undefined8 *)(local_78.pointer.ptr + iVar13 * 0x10 + 8);
          bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_a8.pointer);
          pdVar1[iVar20] = bVar8;
          iVar20 = iVar20 + 1;
        } while (count != iVar20);
      }
    }
    else if (count != 0) {
      lVar4 = *(long *)local_78._0_8_;
      uVar18 = 0;
      do {
        uVar16 = uVar18;
        if (lVar4 != 0) {
          uVar16 = (ulong)*(uint *)(lVar4 + uVar18 * 4);
        }
        if ((*(ulong *)(local_68 + (uVar16 >> 6) * 8) >> (uVar16 & 0x3f) & 1) == 0) {
          _Var12._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8.pointer,&local_80);
            uVar7 = local_a8.pointer.ptr;
            uVar6 = local_a8._0_8_;
            local_a8._0_8_ = (element_type *)0x0;
            local_a8.pointer.ptr = (char *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar6;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.pointer.ptr !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.pointer.ptr);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var12._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var12._M_head_impl;
          }
          bVar5 = (byte)uVar18 & 0x3f;
          _Var12._M_head_impl[uVar18 >> 6] =
               _Var12._M_head_impl[uVar18 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        else {
          local_a8._0_8_ = *(undefined8 *)(local_78.pointer.ptr + uVar16 * 0x10);
          local_a8.pointer.ptr = (char *)*(undefined8 *)(local_78.pointer.ptr + uVar16 * 0x10 + 8);
          bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_a8.pointer);
          pdVar1[uVar18] = bVar8;
        }
        uVar18 = uVar18 + 1;
      } while (count != uVar18);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void RegularLikeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	if (func_expr.bind_info) {
		auto &matcher = func_expr.bind_info->Cast<LikeMatcher>();
		// use fast like matcher
		UnaryExecutor::Execute<string_t, bool>(input.data[0], result, input.size(), [&](string_t input) {
			return INVERT ? !matcher.Match(input) : matcher.Match(input);
		});
	} else {
		// use generic like matcher
		BinaryExecutor::ExecuteStandard<string_t, string_t, bool, OP>(input.data[0], input.data[1], result,
		                                                              input.size());
	}
}